

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O2

char * __thiscall Database::MaxHeap::getResults(MaxHeap *this)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  int i;
  uint right;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  right = (uint)this->size;
  while (1 < (int)right) {
    right = right - 1;
    swap(this,0,right);
    adjust(this,right);
  }
  uVar6 = (ulong)this->size;
  pcVar3 = (char *)operator_new__(uVar6 * 0x28 + 0x28);
  builtin_strncpy(pcVar3,"l_orderkey|o_orderdate|revenue\n",0x20);
  iVar5 = 0x1f;
  for (uVar4 = 0; (uVar4 < uVar6 && (this->c3Result[uVar4] != 0)); uVar4 = uVar4 + 1) {
    uVar1 = this->c2Result[uVar4];
    iVar2 = sprintf(pcVar3 + iVar5,"%u|199%d-%02d-%02d|%.2f\n",
                    SUB84((double)this->c3Result[uVar4] / 100.0,0),(ulong)this->c1Result[uVar4],
                    (ulong)(ushort)(uVar1 / 10000 + 2),(ulong)(ushort)((uVar1 % 10000) / 100),
                    (ulong)(uVar1 % 100));
    iVar5 = iVar5 + iVar2;
    uVar6 = (ulong)this->size;
  }
  return pcVar3;
}

Assistant:

char* getResults() {
      for (int i = size - 1; i > 0; i--) {
        swap(0, i);
        adjust(i);
      }

      auto char_buf = new char[40 * (size + 1)];
      int pos = 0;
      pos += sprintf(char_buf, "l_orderkey|o_orderdate|revenue\n");
      for (int i = 0; i < size; i++) {
        if (c3Result[i] > 0) {
          pos += sprintf(char_buf + pos,
                         "%u|199%d-%02d-%02d|%.2f\n", c1Result[i],
                         c2Result[i] / 10000 + 2, (c2Result[i] % 10000) / 100, c2Result[i] % 100,
                         (double) c3Result[i] / 100.0);
        } else {
          break;
        }
      }
      return char_buf;
    }